

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_parser.c
# Opt level: O2

HT_ErrorCode set_global_timeline_buffer_size(int argc,char **argv,int pos)

{
  char *__nptr;
  int *piVar1;
  ulong buffer_size;
  HT_ErrorCode HVar2;
  char *end;
  
  if (pos + 1 < argc) {
    __nptr = argv[pos + 1];
    piVar1 = __errno_location();
    *piVar1 = 0;
    HVar2 = HT_ERR_INVALID_FORMAT;
    buffer_size = strtoul(__nptr,&end,10);
    if (*piVar1 == 0x22) {
      HVar2 = HT_ERR_OUT_OF_RANGE;
    }
    else if (end != __nptr) {
      ht_global_timeline_set_buffer_size(buffer_size);
      HVar2 = HT_ERR_OK;
    }
  }
  else {
    HVar2 = HT_ERR_MISSING_ARGUMENT;
  }
  return HVar2;
}

Assistant:

static HT_ErrorCode
set_global_timeline_buffer_size(int argc, char** argv, int pos)
{
    if (pos + 1 >= argc)
    {
        return HT_ERR_MISSING_ARGUMENT;
    }

    const char* s = argv[pos + 1];
    char* end;
    errno = 0;
    unsigned long value = strtoul(s, &end, 10);

    if (errno == ERANGE ||
        (sizeof(size_t) < sizeof(unsigned long) && (unsigned long)HT_SIZE_MAX < value))
    {
        return HT_ERR_OUT_OF_RANGE;
    }

    if (end - s == 0)
    {
        return HT_ERR_INVALID_FORMAT;
    }

    ht_global_timeline_set_buffer_size((size_t) value);
    return HT_ERR_OK;
}